

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

counting_iterator
fmt::v7::detail::write_exponent<char,fmt::v7::detail::counting_iterator>
          (int exp,counting_iterator it)

{
  counting_iterator local_98;
  value_type local_8b;
  char local_8a [2];
  counting_iterator local_88;
  value_type local_7a;
  char local_79;
  char *local_78;
  char *d;
  counting_iterator local_68;
  value_type local_5b;
  char local_5a [2];
  counting_iterator local_58;
  value_type local_4a;
  char local_49;
  char *local_48;
  char *top;
  counting_iterator local_38;
  value_type local_2b;
  char local_2a [2];
  counting_iterator local_28;
  value_type local_1e;
  char local_1d;
  int local_1c;
  counting_iterator cStack_18;
  int exp_local;
  counting_iterator it_local;
  
  local_1c = exp;
  cStack_18.count_ = it.count_;
  if ((-10000 < exp) && (exp < 10000)) {
    if (exp < 0) {
      local_1d = '-';
      local_28 = counting_iterator::operator++(&stack0xffffffffffffffe8,0);
      counting_iterator::operator*(&local_28);
      counting_iterator::value_type::operator=(&local_1e,&local_1d);
      local_1c = -local_1c;
    }
    else {
      local_2a[0] = '+';
      local_38 = counting_iterator::operator++(&stack0xffffffffffffffe8,0);
      counting_iterator::operator*(&local_38);
      counting_iterator::value_type::operator=(&local_2b,local_2a);
    }
    if (99 < local_1c) {
      local_48 = basic_data<void>::digits + (long)(local_1c / 100) * 2;
      if (999 < local_1c) {
        local_49 = *local_48;
        local_58 = counting_iterator::operator++(&stack0xffffffffffffffe8,0);
        counting_iterator::operator*(&local_58);
        counting_iterator::value_type::operator=(&local_4a,&local_49);
      }
      local_5a[0] = local_48[1];
      local_68 = counting_iterator::operator++(&stack0xffffffffffffffe8,0);
      counting_iterator::operator*(&local_68);
      counting_iterator::value_type::operator=(&local_5b,local_5a);
      local_1c = local_1c % 100;
    }
    local_78 = basic_data<void>::digits + (long)local_1c * 2;
    local_79 = *local_78;
    local_88 = counting_iterator::operator++(&stack0xffffffffffffffe8,0);
    counting_iterator::operator*(&local_88);
    counting_iterator::value_type::operator=(&local_7a,&local_79);
    local_8a[0] = local_78[1];
    local_98 = counting_iterator::operator++(&stack0xffffffffffffffe8,0);
    counting_iterator::operator*(&local_98);
    counting_iterator::value_type::operator=(&local_8b,local_8a);
    return (counting_iterator)cStack_18.count_;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/../extern/fmt/include/fmt/format.h"
              ,0x452,"exponent out of range");
}

Assistant:

It write_exponent(int exp, It it) {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = data::digits[exp / 100];
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = data::digits[exp];
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}